

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcolor.c
# Opt level: O0

FT_Error FT_Palette_Data_Get(FT_Face face,FT_Palette_Data *apalette_data)

{
  FT_Palette_Data *apalette_data_local;
  FT_Face face_local;
  
  if (face == (FT_Face)0x0) {
    face_local._4_4_ = 0x23;
  }
  else if (apalette_data == (FT_Palette_Data *)0x0) {
    face_local._4_4_ = 6;
  }
  else {
    if ((face->face_flags & 8U) == 0) {
      memcpy(apalette_data,&null_palette_data,0x28);
    }
    else {
      memcpy(apalette_data,&face[4].num_fixed_sizes,0x28);
    }
    face_local._4_4_ = 0;
  }
  return face_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Palette_Data_Get( FT_Face           face,
                       FT_Palette_Data  *apalette_data )
  {
    if ( !face )
      return FT_THROW( Invalid_Face_Handle );
    if ( !apalette_data)
      return FT_THROW( Invalid_Argument );

    if ( FT_IS_SFNT( face ) )
      *apalette_data = ( (TT_Face)face )->palette_data;
    else
      *apalette_data = null_palette_data;

    return FT_Err_Ok;
  }